

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O3

lzma_ret lzma_lzma_decoder_create
                   (lzma_lz_decoder *lz,lzma_allocator *allocator,void *opt,
                   lzma_lz_options *lz_options)

{
  void *pvVar1;
  
  if (lz->coder == (void *)0x0) {
    pvVar1 = lzma_alloc(0x6ec0,allocator);
    lz->coder = pvVar1;
    if (pvVar1 == (void *)0x0) {
      return LZMA_MEM_ERROR;
    }
    lz->code = lzma_decode;
    lz->reset = lzma_decoder_reset;
    lz->set_uncompressed = lzma_decoder_uncompressed;
  }
  lz_options->dict_size = (ulong)*opt;
  lz_options->preset_dict = *(uint8_t **)((long)opt + 8);
  lz_options->preset_dict_size = (ulong)*(uint *)((long)opt + 0x10);
  return LZMA_OK;
}

Assistant:

extern lzma_ret
lzma_lzma_decoder_create(lzma_lz_decoder *lz, const lzma_allocator *allocator,
		const void *opt, lzma_lz_options *lz_options)
{
	if (lz->coder == NULL) {
		lz->coder = lzma_alloc(sizeof(lzma_lzma1_decoder), allocator);
		if (lz->coder == NULL)
			return LZMA_MEM_ERROR;

		lz->code = &lzma_decode;
		lz->reset = &lzma_decoder_reset;
		lz->set_uncompressed = &lzma_decoder_uncompressed;
	}

	// All dictionary sizes are OK here. LZ decoder will take care of
	// the special cases.
	const lzma_options_lzma *options = opt;
	lz_options->dict_size = options->dict_size;
	lz_options->preset_dict = options->preset_dict;
	lz_options->preset_dict_size = options->preset_dict_size;

	return LZMA_OK;
}